

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

Value * __thiscall
soul::heart::TypeCast::getAsConstant(Value *__return_storage_ptr__,TypeCast *this)

{
  bool bVar1;
  Expression *pEVar2;
  undefined1 local_58 [8];
  Value sourceValue;
  TypeCast *this_local;
  
  sourceValue.allocatedData.allocatedData.space[0] = (uint64_t)this;
  pEVar2 = pool_ref<soul::heart::Expression>::operator->(&this->source);
  (*(pEVar2->super_Object)._vptr_Object[7])();
  bVar1 = soul::Value::isValid((Value *)local_58);
  if (bVar1) {
    soul::Value::tryCastToType(__return_storage_ptr__,(Value *)local_58,&this->destType);
  }
  else {
    soul::Value::Value(__return_storage_ptr__);
  }
  soul::Value::~Value((Value *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Value getAsConstant() const override
        {
            auto sourceValue = source->getAsConstant();

            if (sourceValue.isValid())
                return sourceValue.tryCastToType (destType);

            return {};
        }